

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

int xmlBufferShrink(xmlBufferPtr buf,uint len)

{
  uint len_local;
  xmlBufferPtr buf_local;
  
  if (buf == (xmlBufferPtr)0x0) {
    buf_local._4_4_ = 0xffffffff;
  }
  else if (len == 0) {
    buf_local._4_4_ = 0;
  }
  else if (buf->use < len) {
    buf_local._4_4_ = 0xffffffff;
  }
  else {
    buf->use = buf->use - len;
    buf_local._4_4_ = len;
    if (buf->alloc == XML_BUFFER_ALLOC_IO) {
      buf->content = buf->content + len;
      buf->size = buf->size - len;
    }
    else {
      memmove(buf->content,buf->content + len,(ulong)(buf->use + 1));
    }
  }
  return buf_local._4_4_;
}

Assistant:

int
xmlBufferShrink(xmlBufferPtr buf, unsigned int len) {
    if (buf == NULL)
        return(-1);
    if (len == 0)
        return(0);
    if (len > buf->use)
        return(-1);

    buf->use -= len;

    if (buf->alloc == XML_BUFFER_ALLOC_IO) {
        buf->content += len;
	buf->size -= len;
    } else {
	memmove(buf->content, &buf->content[len], buf->use + 1);
    }

    return(len);
}